

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int conditional_skipintra(PREDICTION_MODE mode,PREDICTION_MODE best_intra_mode)

{
  PREDICTION_MODE best_intra_mode_local;
  PREDICTION_MODE mode_local;
  undefined4 local_4;
  
  if (((mode == '\x05') && (best_intra_mode != '\x01')) && (best_intra_mode != '\x04')) {
    local_4 = 1;
  }
  else if (((mode == '\b') && (best_intra_mode != '\x01')) && (best_intra_mode != '\x03')) {
    local_4 = 1;
  }
  else if (((mode == '\a') && (best_intra_mode != '\x02')) && (best_intra_mode != '\x03')) {
    local_4 = 1;
  }
  else if (((mode == '\x06') && (best_intra_mode != '\x02')) && (best_intra_mode != '\x04')) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int conditional_skipintra(PREDICTION_MODE mode,
                                 PREDICTION_MODE best_intra_mode) {
  if (mode == D113_PRED && best_intra_mode != V_PRED &&
      best_intra_mode != D135_PRED)
    return 1;
  if (mode == D67_PRED && best_intra_mode != V_PRED &&
      best_intra_mode != D45_PRED)
    return 1;
  if (mode == D203_PRED && best_intra_mode != H_PRED &&
      best_intra_mode != D45_PRED)
    return 1;
  if (mode == D157_PRED && best_intra_mode != H_PRED &&
      best_intra_mode != D135_PRED)
    return 1;
  return 0;
}